

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

consume_operation * __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
::try_start_consume(consume_operation *__return_storage_ptr__,
                   conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
                   *this)

{
  ControlBlock *pCVar1;
  InnerQueue *this_00;
  consume_operation consume;
  unique_lock<std::mutex> lock;
  consume_operation local_40;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->m_mutex);
  this_00 = &this->m_queue;
  pCVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(this_00);
  local_40.m_queue = this_00;
  if (pCVar1 == (ControlBlock *)0x0) {
    local_40.m_control = pCVar1;
    std::unique_lock<std::mutex>::unlock(&local_30);
  }
  (__return_storage_ptr__->m_lock)._M_device = local_30._M_device;
  local_30._M_device = (mutex_type *)0x0;
  (__return_storage_ptr__->m_lock)._M_owns = local_30._M_owns;
  local_30._M_owns = false;
  (__return_storage_ptr__->m_consume_operation).m_queue = this_00;
  (__return_storage_ptr__->m_consume_operation).m_control = pCVar1;
  local_40.m_control = (ControlBlock *)0x0;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

consume_operation try_start_consume() noexcept
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            auto                         consume = m_queue.try_start_consume();
            if (!consume)
                lock.unlock();
            return consume_operation(PrivateType(), std::move(lock), std::move(consume));
        }